

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::editLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  _Alloc_hider _Var1;
  char cVar2;
  pointer pbVar3;
  pointer pcVar4;
  byte bVar5;
  size_t sVar6;
  int iVar7;
  ssize_t sVar8;
  undefined8 uVar9;
  Direction dir;
  bool bVar10;
  bool bVar11;
  char ch;
  char seq [5];
  hints_type hc;
  byte local_be;
  char local_bd;
  byte local_bc;
  char local_bb;
  byte local_ba;
  char local_b9;
  State local_b8;
  _Any_data *local_68;
  _Manager_type *local_60;
  _Any_data local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  termios *local_38;
  
  local_b8.buf._M_dataplus._M_p = (pointer)&local_b8.buf.field_2;
  local_b8.buf._M_string_length = 0;
  local_b8.buf.field_2._M_local_buf[0] = '\0';
  local_b8.pos = 0;
  local_b8.oldpos = 0;
  local_b8.cols = 0;
  local_b8.maxrows._0_1_ = 0;
  local_b8.maxrows._1_7_ = 0;
  local_b8.history_index._0_1_ = 0;
  local_b8.history_index._1_7_ = 0;
  local_b8.mask_mode = false;
  iVar7 = getColumns(this);
  local_b8.cols = (size_t)iVar7;
  local_b8.maxrows._0_1_ = 0;
  local_b8.maxrows._1_7_ = 0;
  local_b8.history_index._0_1_ = 0;
  local_b8.history_index._1_7_ = 0;
  local_b8.mask_mode = mask_mode;
  local_58._M_unused._M_object = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  addHistoryEntry(this,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_unused._0_8_ != &local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48._M_allocated_capacity + 1));
  }
  sVar8 = write(this->out_fd_,(this->prompt)._M_dataplus._M_p,(this->prompt)._M_string_length);
  if (sVar8 == -1) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    _Var1._M_p = (pointer)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10);
    local_38 = (termios *)&this->orig_termios_;
    local_68 = (_Any_data *)&this->hints_handler_;
    local_60 = &(this->hints_handler_).super__Function_base._M_manager;
    do {
      sVar8 = read(this->in_fd_,&local_be,1);
      bVar5 = local_be;
      if (sVar8 < 1) {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = _Var1._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_b8.buf._M_dataplus._M_p,
                   local_b8.buf._M_dataplus._M_p + local_b8.buf._M_string_length);
LAB_00103d3f:
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        goto LAB_00103d43;
      }
      if (this->complete_key_ == (int)(char)local_be) {
        iVar7 = completeLine(this,&local_b8);
        if ((char)bVar5 < '\0') {
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = _Var1._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_b8.buf._M_dataplus._M_p,
                     local_b8.buf._M_dataplus._M_p + local_b8.buf._M_string_length);
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          bVar11 = true;
LAB_00103d78:
          bVar10 = false;
        }
        else {
          bVar11 = false;
          if (bVar5 == 0) {
            bVar11 = false;
            goto LAB_00103d78;
          }
          local_be = (byte)iVar7;
          bVar10 = true;
        }
        if (bVar10) goto LAB_00103d82;
        goto switchD_00104161_caseD_45;
      }
LAB_00103d82:
      dir = Prev;
      sVar6 = local_b8.pos;
      switch(local_be) {
      case 1:
        if (local_b8.pos != 0) {
LAB_001040ab:
          local_b8.pos = 0;
          sVar6 = local_b8.pos;
          goto LAB_001040e9;
        }
        break;
      case 2:
        if (local_b8.pos != 0) {
LAB_00104095:
          sVar6 = local_b8.pos - 1;
          goto LAB_001040e9;
        }
        break;
      case 3:
        goto switchD_00103da8_caseD_3;
      case 4:
        if (local_b8.buf._M_string_length == 0) {
          pbVar3 = (this->history_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (this->history_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
          pcVar4 = pbVar3[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar3[-1].field_2) {
            operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
          }
          goto switchD_00103da8_caseD_3;
        }
LAB_00104020:
        editDelete(this,&local_b8);
        break;
      case 5:
        sVar6 = local_b8.buf._M_string_length;
        if (local_b8.pos != local_b8.buf._M_string_length) goto LAB_001040e9;
        break;
      case 6:
        if (local_b8.pos != local_b8.buf._M_string_length) {
LAB_00103fdd:
          sVar6 = local_b8.pos + 1;
          goto LAB_001040e9;
        }
        break;
      case 7:
      case 9:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x16:
      case 0x18:
      case 0x19:
        goto switchD_00103da8_caseD_7;
      case 8:
switchD_00103da8_caseD_8:
        editBackspace(this,&local_b8);
        break;
      case 10:
      case 0xd:
        pbVar3 = (this->history_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->history_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
        if ((this->multiline_mode == true) && (local_b8.pos != local_b8.buf._M_string_length)) {
          local_b8.pos = local_b8.buf._M_string_length;
          refreshLine(this,&local_b8);
        }
        if (*local_60 != (_Manager_type)0x0) {
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::function((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&local_58,
                     (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)local_68);
          if (*local_60 != (_Manager_type)0x0) {
            (**local_60)(local_68,local_68,__destroy_functor);
            *local_60 = (_Manager_type)0x0;
            local_60[1] = (_Manager_type)0x0;
          }
          refreshLine(this,&local_b8);
          std::
          function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          ::operator=((function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_68,
                      (function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)&local_58);
          if ((code *)local_48._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_48._M_allocated_capacity)(&local_58,&local_58,3);
          }
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = _Var1._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_b8.buf._M_dataplus._M_p,
                   local_b8.buf._M_dataplus._M_p + local_b8.buf._M_string_length);
        goto LAB_00103d3f;
      case 0xb:
        if (local_b8.buf._M_string_length < local_b8.pos) {
          uVar9 = std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                             "basic_string::erase");
          __clang_call_terminate(uVar9);
        }
        local_b8.buf._M_string_length = local_b8.pos;
        local_b8.buf._M_dataplus._M_p[local_b8.pos] = '\0';
        goto LAB_001040e9;
      case 0xc:
        write(this->out_fd_,"\x1b[H\x1b[2J",7);
        sVar6 = local_b8.pos;
        goto LAB_001040e9;
      case 0xe:
switchD_00103da8_caseD_e:
        dir = Next;
      case 0x10:
switchD_00103da8_caseD_10:
        editHistoryNext(this,&local_b8,dir);
        break;
      case 0x14:
        bVar11 = false;
        if ((local_b8.pos != 0) && (local_b8.pos < local_b8.buf._M_string_length)) {
          cVar2 = local_b8.buf._M_dataplus._M_p[local_b8.pos];
          local_b8.buf._M_dataplus._M_p[local_b8.pos] =
               local_b8.buf._M_dataplus._M_p[local_b8.pos - 1];
          local_b8.buf._M_dataplus._M_p[local_b8.pos - 1] = cVar2;
          if (local_b8.pos != local_b8.buf._M_string_length - 1) goto LAB_00103fdd;
          goto LAB_001040e9;
        }
        goto switchD_00104161_caseD_45;
      case 0x15:
        local_b8.buf._M_string_length = 0;
        *local_b8.buf._M_dataplus._M_p = '\0';
        local_b8.pos = 0;
        sVar6 = local_b8.pos;
LAB_001040e9:
        local_b8.pos = sVar6;
        refreshLine(this,&local_b8);
        break;
      case 0x17:
        editDeletePreviousWord(this,&local_b8);
        break;
      case 0x1a:
        if ((this->raw_mode_ == true) && (iVar7 = tcsetattr(this->in_fd_,2,local_38), iVar7 != -1))
        {
          this->raw_mode_ = false;
        }
        raise(0x14);
        enableRawMode(this,this->in_fd_);
        refreshLine(this,&local_b8);
        bVar11 = false;
        goto switchD_00104161_caseD_45;
      case 0x1b:
        sVar8 = read(this->in_fd_,&local_bd,1);
        bVar10 = false;
        bVar11 = false;
        if ((sVar8 != -1) && (sVar8 = read(this->in_fd_,&local_bc,1), sVar8 != -1)) {
          bVar11 = bVar10;
          if (local_bd == 'O') {
            if (local_bc == 0x46) {
switchD_00104161_caseD_46:
              sVar6 = local_b8.buf._M_string_length;
              if (local_b8.pos != local_b8.buf._M_string_length) goto LAB_001040e9;
            }
            else if (local_bc == 0x48) {
switchD_00104161_caseD_48:
              if (local_b8.pos != 0) goto LAB_001040ab;
            }
          }
          else if (local_bd == '[') {
            if ((int)(char)local_bc - 0x30U < 10) {
              sVar8 = read(this->in_fd_,&local_bb,1);
              if (sVar8 != -1) {
                if (local_bb == ';') {
                  sVar8 = read(this->in_fd_,&local_ba,1);
                  if ((sVar8 != -1) && (sVar8 = read(this->in_fd_,&local_b9,1), sVar8 != -1)) {
                    if (local_b9 == 'D' && (local_ba ^ 0x35) == 0) {
                      editMovePrevWord(this,&local_b8);
                    }
                    else if ((local_ba ^ 0x35) == 0 && local_b9 == 'C') {
                      editMoveNextWord(this,&local_b8);
                    }
                  }
                }
                else if ((local_bb == '~') && (local_bc == 0x33)) goto LAB_00104020;
              }
            }
            else {
              switch(local_bc) {
              case 0x41:
                goto switchD_00103da8_caseD_10;
              case 0x42:
                goto switchD_00103da8_caseD_e;
              case 0x43:
                if (local_b8.pos != local_b8.buf._M_string_length) goto LAB_00103fdd;
                break;
              case 0x44:
                if (local_b8.pos != 0) goto LAB_00104095;
                break;
              case 0x46:
                goto switchD_00104161_caseD_46;
              case 0x48:
                goto switchD_00104161_caseD_48;
              }
            }
          }
        }
        goto switchD_00104161_caseD_45;
      default:
        if (local_be == 0x7f) goto switchD_00103da8_caseD_8;
switchD_00103da8_caseD_7:
        iVar7 = editInsert(this,&local_b8,local_be);
        if (iVar7 == 0) break;
switchD_00103da8_caseD_3:
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
LAB_00103d43:
        bVar11 = true;
        goto switchD_00104161_caseD_45;
      }
      bVar11 = false;
switchD_00104161_caseD_45:
    } while (!bVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.buf._M_dataplus._M_p != &local_b8.buf.field_2) {
    operator_delete(local_b8.buf._M_dataplus._M_p,
                    CONCAT71(local_b8.buf.field_2._M_allocated_capacity._1_7_,
                             local_b8.buf.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> editLine(bool mask_mode) {
		State state;

		// Populate the state that we pass to functions implementing specific editing functionalities.
		state.oldpos        = 0;
		state.pos           = 0;
		state.cols          = getColumns();
		state.maxrows       = 0;
		state.history_index = 0;
		state.mask_mode     = mask_mode;

		// The latest history entry is always our current buffer, that initially is just an empty string.
		addHistoryEntry("");

		if (write_string(prompt) == -1) {
			return {};
		}

		while (true) {

			char ch;
			if (read_char(&ch) <= 0) {
				return state.buf;
			}

			// Only autocomplete when the callback is set.
			if (ch == complete_key_) {
				int r = completeLine(&state);
				// Return on errors
				if (ch < 0)
					return state.buf;

				// Read next character when 0
				if (ch == '\0')
					continue;

				ch = r;
			}

			char seq[5];
			switch (ch) {
			case LINE_FEED:
			case ENTER: // enter
				history_.pop_back();

				if (multiline_mode) {
					editMoveEnd(&state);
				}

				if (hints_handler_) {
					// Force a refresh without hints to leave the previous line as the user typed it after a newline.
					hints_type hc  = hints_handler_;
					hints_handler_ = nullptr;
					refreshLine(&state);
					hints_handler_ = hc;
				}
				return state.buf;
			case CTRL_C: // ctrl-c
				return {};
			case CTRL_Z: // ctrl-z
#ifdef SIGTSTP
				// send ourselves SIGSUSP
				disableRawMode(in_fd_);
				raise(SIGTSTP);
				// and resume
				enableRawMode(in_fd_);
				refreshLine(&state);
#endif
				continue;
			case BACKSPACE: // backspace
			case CTRL_H:    // ctrl-h
				editBackspace(&state);
				break;
			case CTRL_D: // ctrl-d, remove char at right of cursor, or if the line is empty, act as end-of-file.
				if (!state.buf.empty()) {
					editDelete(&state);
				} else {
					history_.pop_back();
					return {};
				}
				break;
			case CTRL_T: // ctrl-t, swaps current character with previous.
				if (state.pos > 0 && state.pos < state.buf.size()) {
					std::swap(state.buf[state.pos], state.buf[state.pos - 1]);

					if (state.pos != state.buf.size() - 1) {
						state.pos++;
					}
					refreshLine(&state);
				}
				break;
			case CTRL_B: // ctrl-b
				editMoveLeft(&state);
				break;
			case CTRL_F: // ctrl-f
				editMoveRight(&state);
				break;
			case CTRL_P: // ctrl-p
				editHistoryNext(&state, Direction::Prev);
				break;
			case CTRL_N: // ctrl-n
				editHistoryNext(&state, Direction::Next);
				break;
			case ESC: // escape sequence
				// Read the next two bytes representing the escape sequence.
				// Use two calls to handle slow terminals returning the two chars at different times.
				if (read_char(&seq[0]) == -1) {
					break;
				}

				if (read_char(&seq[1]) == -1) {
					break;
				}

				// ESC [ sequences.
				if (seq[0] == '[') {
					if (isdigit(seq[1])) {

						// Extended escape, read additional byte.
						if (read_char(&seq[2]) == -1) {
							break;
						}

						switch (seq[2]) {
						case '~':
							switch (seq[1]) {
							case '3': // Delete key.
								editDelete(&state);
								break;
							}
							break;
						case ';':
							// Read the next two bytes representing the escape sequence.
							// Use two calls to handle slow terminals returning the two chars at different times.
							if (read_char(&seq[3]) == -1) {
								break;
							}

							if (read_char(&seq[4]) == -1) {
								break;
							}

							if (seq[3] == '5' && seq[4] == 'D') {
								editMovePrevWord(&state);
							} else if (seq[3] == '5' && seq[4] == 'C') {
								editMoveNextWord(&state);
							}
							break;
						}
					} else {
						switch (seq[1]) {
						case 'A': // Up
							editHistoryNext(&state, Direction::Prev);
							break;
						case 'B': // Down
							editHistoryNext(&state, Direction::Next);
							break;
						case 'C': // Right
							editMoveRight(&state);
							break;
						case 'D': // Left
							editMoveLeft(&state);
							break;
						case 'H': // Home
							editMoveHome(&state);
							break;
						case 'F': // End
							editMoveEnd(&state);
							break;
						}
					}
				}

				// ESC O sequences.
				else if (seq[0] == 'O') {
					switch (seq[1]) {
					case 'H': // Home
						editMoveHome(&state);
						break;
					case 'F': // End
						editMoveEnd(&state);
						break;
					}
				}
				break;
			default:
				if (editInsert(&state, ch)) {
					return {};
				}
				break;
			case CTRL_U: // Ctrl+u, delete the whole line.
				state.buf.clear();
				state.pos = 0;
				refreshLine(&state);
				break;
			case CTRL_K: // Ctrl+k, delete from current to end of line.
				state.buf.erase(state.pos);
				refreshLine(&state);
				break;
			case CTRL_A: // Ctrl+a, go to the start of the line
				editMoveHome(&state);
				break;
			case CTRL_E: // ctrl+e, go to the end of the line
				editMoveEnd(&state);
				break;
			case CTRL_L: // ctrl+l, clear screen
				clearScreen();
				refreshLine(&state);
				break;
			case CTRL_W: // ctrl+w, delete previous word
				editDeletePreviousWord(&state);
				break;
			}
		}
		return state.buf;
	}